

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_BX(DisasContext_conflict1 *s,arg_BX *a)

{
  int iVar1;
  TCGv_i32 var;
  arg_BX *a_local;
  DisasContext_conflict1 *s_local;
  
  iVar1 = arm_dc_feature(s,0xe);
  if (iVar1 != 0) {
    var = load_reg(s,a->rm);
    gen_bx_excret(s,var);
  }
  return iVar1 != 0;
}

Assistant:

static bool trans_BX(DisasContext *s, arg_BX *a)
{
    if (!ENABLE_ARCH_4T) {
        return false;
    }
    gen_bx_excret(s, load_reg(s, a->rm));
    return true;
}